

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

BrotliDecoderErrorCode
DecodeContextMap(uint32_t context_map_size,uint32_t *num_htrees,uint8_t **context_map_arg,
                BrotliDecoderStateInternal *s)

{
  byte *pbVar1;
  uint uVar2;
  BrotliDecoderErrorCode BVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t uVar9;
  HuffmanCode *pHVar10;
  BrotliBitReader *br;
  int iVar11;
  size_t sVar12;
  uint64_t uVar13;
  BrotliRunningContextMapState BVar14;
  uint32_t code;
  uint local_44;
  uint8_t **local_40;
  BrotliBitReader *local_38;
  
  if (BROTLI_STATE_CONTEXT_MAP_TRANSFORM < s->substate_context_map) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  br = &s->br;
  local_40 = context_map_arg;
  local_38 = br;
  switch(s->substate_context_map) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    BVar3 = DecodeVarLenUint8(s,br,num_htrees);
    if (BVar3 != BROTLI_DECODER_SUCCESS) {
      return BVar3;
    }
    *num_htrees = *num_htrees + 1;
    s->context_index = 0;
    puVar4 = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,(ulong)context_map_size);
    *local_40 = puVar4;
    if (puVar4 == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*num_htrees < 2) {
      memset(puVar4,0,(ulong)context_map_size);
      return BROTLI_DECODER_SUCCESS;
    }
    s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
  case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX:
    uVar6 = (s->br).bit_pos_;
    if (uVar6 - 0x3c < 5) {
      sVar12 = (s->br).avail_in;
      if (sVar12 == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar8 = (s->br).val_;
      pbVar1 = (s->br).next_in;
      (s->br).val_ = uVar8 >> 8;
      uVar13 = (ulong)*pbVar1 << 0x38 | uVar8 >> 8;
      (s->br).val_ = uVar13;
      uVar6 = uVar6 - 8;
      (s->br).avail_in = sVar12 - 1;
      (s->br).next_in = pbVar1 + 1;
    }
    else {
      uVar13 = local_38->val_;
    }
    uVar7 = (uint)(uVar13 >> ((byte)uVar6 & 0x3f));
    uVar2 = uVar7 & 1;
    uVar9 = (uVar7 >> 1 & 0xf) + 1 & -uVar2;
    s->max_run_length_prefix = uVar9;
    (s->br).bit_pos_ = uVar6 + uVar2 * 4 + 1;
    s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
    break;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    uVar9 = s->max_run_length_prefix;
    break;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    local_44 = s->code;
    goto LAB_00103649;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
    goto switchD_001034fd_caseD_4;
  }
  BVar3 = ReadHuffmanCode(uVar9 + *num_htrees,s->context_map_table,(uint32_t *)0x0,s);
  if (BVar3 != BROTLI_DECODER_SUCCESS) {
    return BVar3;
  }
  s->code = 0xffff;
  s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
  local_44 = 0xffff;
LAB_00103649:
  uVar8 = (ulong)s->context_index;
  uVar2 = s->max_run_length_prefix;
  puVar4 = *local_40;
  br = local_38;
  if (local_44 == 0xffff) goto LAB_00103714;
LAB_0010366e:
  uVar9 = (s->br).bit_pos_;
  uVar7 = 0x40 - uVar9;
  if (uVar7 < local_44) {
    sVar12 = (s->br).avail_in;
    do {
      sVar12 = sVar12 - 1;
      if (sVar12 == 0xffffffffffffffff) {
LAB_001038a6:
        s->code = local_44;
        s->context_index = (uint32_t)uVar8;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar5 = (s->br).val_;
      pbVar1 = (s->br).next_in;
      (s->br).val_ = uVar5 >> 8;
      uVar13 = (ulong)*pbVar1 << 0x38 | uVar5 >> 8;
      (s->br).val_ = uVar13;
      uVar9 = uVar9 - 8;
      (s->br).bit_pos_ = uVar9;
      (s->br).avail_in = sVar12;
      (s->br).next_in = pbVar1 + 1;
      uVar7 = uVar7 + 8;
    } while (uVar7 < local_44);
  }
  else {
    uVar13 = br->val_;
  }
  uVar7 = kBitMask[local_44];
  (s->br).bit_pos_ = uVar9 + local_44;
  iVar11 = (1 << ((byte)local_44 & 0x1f)) + ((uint)(uVar13 >> ((byte)uVar9 & 0x3f)) & uVar7);
  if (context_map_size < (uint)(iVar11 + (int)uVar8)) {
    return BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
  }
  do {
    uVar5 = uVar8 & 0xffffffff;
    uVar8 = (ulong)((int)uVar8 + 1);
    puVar4[uVar5] = '\0';
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
LAB_00103714:
  if ((uint)uVar8 < context_map_size) {
    do {
      uVar9 = (s->br).bit_pos_;
      if (uVar9 - 0x32 < 0xf) {
        sVar12 = (s->br).avail_in;
        uVar6 = uVar9;
        do {
          sVar12 = sVar12 - 1;
          if (sVar12 == 0xffffffffffffffff) {
            iVar11 = SafeDecodeSymbol(s->context_map_table,br,&local_44);
            br = local_38;
            if (iVar11 != 0) goto LAB_001037f8;
            local_44 = 0xffff;
            goto LAB_001038a6;
          }
          uVar5 = (s->br).val_;
          pbVar1 = (s->br).next_in;
          (s->br).val_ = uVar5 >> 8;
          uVar5 = (ulong)*pbVar1 << 0x38 | uVar5 >> 8;
          (s->br).val_ = uVar5;
          uVar9 = uVar6 - 8;
          (s->br).bit_pos_ = uVar9;
          (s->br).avail_in = sVar12;
          (s->br).next_in = pbVar1 + 1;
          uVar7 = uVar6 - 0x3a;
          uVar6 = uVar9;
        } while (uVar7 < 0xf);
      }
      else {
        uVar5 = br->val_;
      }
      uVar5 = uVar5 >> ((byte)uVar9 & 0x3f);
      pHVar10 = s->context_map_table + (uVar5 & 0xff);
      uVar7 = (uint)pHVar10->bits;
      if (8 < uVar7) {
        uVar9 = uVar9 + 8;
        pHVar10 = pHVar10 + (ulong)pHVar10->value +
                            (ulong)((uint)(uVar5 >> 8) & 0xffffff & kBitMask[pHVar10->bits - 8] &
                                   0x7f);
        uVar7 = (uint)pHVar10->bits;
      }
      (s->br).bit_pos_ = uVar7 + uVar9;
      local_44 = (uint)pHVar10->value;
LAB_001037f8:
      if (local_44 == 0) {
        iVar11 = 0;
      }
      else {
        iVar11 = local_44 - uVar2;
        if (local_44 < uVar2 || iVar11 == 0) goto LAB_0010366e;
      }
      puVar4[uVar8] = (uint8_t)iVar11;
      uVar8 = uVar8 + 1;
      if ((uint32_t)uVar8 == context_map_size) break;
    } while( true );
  }
switchD_001034fd_caseD_4:
  uVar2 = (s->br).bit_pos_;
  uVar8 = (ulong)uVar2;
  if (uVar2 == 0x40) {
    sVar12 = (s->br).avail_in;
    if (sVar12 == 0) {
      BVar3 = BROTLI_DECODER_NEEDS_MORE_INPUT;
      BVar14 = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
      goto LAB_00103898;
    }
    uVar8 = (s->br).val_;
    pbVar1 = (s->br).next_in;
    (s->br).val_ = uVar8 >> 8;
    uVar5 = (ulong)*pbVar1 << 0x38 | uVar8 >> 8;
    (s->br).val_ = uVar5;
    (s->br).avail_in = sVar12 - 1;
    (s->br).next_in = pbVar1 + 1;
    uVar8 = 0x38;
  }
  else {
    uVar5 = br->val_;
  }
  (s->br).bit_pos_ = (int)uVar8 + 1;
  BVar3 = BROTLI_DECODER_SUCCESS;
  BVar14 = BROTLI_STATE_CONTEXT_MAP_NONE;
  if ((uVar5 >> (uVar8 & 0x3f) & 1) != 0) {
    InverseMoveToFrontTransform(*local_40,context_map_size,s);
  }
LAB_00103898:
  s->substate_context_map = BVar14;
  return BVar3;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(uint32_t context_map_size,
                                               uint32_t* num_htrees,
                                               uint8_t** context_map_arg,
                                               BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;

  switch ((int)s->substate_context_map) {
    case BROTLI_STATE_CONTEXT_MAP_NONE:
      result = DecodeVarLenUint8(s, br, num_htrees);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      (*num_htrees)++;
      s->context_index = 0;
      BROTLI_LOG_UINT(context_map_size);
      BROTLI_LOG_UINT(*num_htrees);
      *context_map_arg = (uint8_t*)BROTLI_ALLOC(s, (size_t)context_map_size);
      if (*context_map_arg == 0) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
      }
      if (*num_htrees <= 1) {
        memset(*context_map_arg, 0, (size_t)context_map_size);
        return BROTLI_DECODER_SUCCESS;
      }
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
      /* No break, continue to next state. */
    case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
      uint32_t bits;
      /* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
         to peek 4 bits ahead. */
      if (!BrotliSafeGetBits(br, 5, &bits)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((bits & 1) != 0) { /* Use RLE for zeros. */
        s->max_run_length_prefix = (bits >> 1) + 1;
        BrotliDropBits(br, 5);
      } else {
        s->max_run_length_prefix = 0;
        BrotliDropBits(br, 1);
      }
      BROTLI_LOG_UINT(s->max_run_length_prefix);
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
      /* No break, continue to next state. */
    }
    case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
      result = ReadHuffmanCode(*num_htrees + s->max_run_length_prefix,
                               s->context_map_table, NULL, s);
      if (result != BROTLI_DECODER_SUCCESS) return result;
      s->code = 0xFFFF;
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
      /* No break, continue to next state. */
    case BROTLI_STATE_CONTEXT_MAP_DECODE: {
      uint32_t context_index = s->context_index;
      uint32_t max_run_length_prefix = s->max_run_length_prefix;
      uint8_t* context_map = *context_map_arg;
      uint32_t code = s->code;
      if (code != 0xFFFF) {
        goto rleCode;
      }
      while (context_index < context_map_size) {
        if (!SafeReadSymbol(s->context_map_table, br, &code)) {
          s->code = 0xFFFF;
          s->context_index = context_index;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        BROTLI_LOG_UINT(code);

        if (code == 0) {
          context_map[context_index++] = 0;
          continue;
        }
        if (code > max_run_length_prefix) {
          context_map[context_index++] =
              (uint8_t)(code - max_run_length_prefix);
          continue;
        }
rleCode:
        {
          uint32_t reps;
          if (!BrotliSafeReadBits(br, code, &reps)) {
            s->code = code;
            s->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          reps += 1U << code;
          BROTLI_LOG_UINT(reps);
          if (context_index + reps > context_map_size) {
            return
                BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
          }
          do {
            context_map[context_index++] = 0;
          } while (--reps);
        }
      }
      /* No break, continue to next state. */
    }
    case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
      uint32_t bits;
      if (!BrotliSafeReadBits(br, 1, &bits)) {
        s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits != 0) {
        InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
      }
      s->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
      return BROTLI_DECODER_SUCCESS;
    }
    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}